

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOCC-CTA-cs16btech11038.cpp
# Opt level: O2

int __thiscall BOCC_CTA::begin_trans(BOCC_CTA *this)

{
  int i;
  Transaction *this_00;
  mapped_type *ppTVar1;
  rep rVar2;
  int id;
  int local_34;
  
  std::__shared_mutex_pthread::lock(&(this->scheduler_lock)._M_impl);
  i = this->counter;
  local_34 = i;
  this_00 = (Transaction *)operator_new(0xc0);
  Transaction::Transaction(this_00,i,this->M);
  ppTVar1 = std::__detail::
            _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->transactions,&local_34);
  *ppTVar1 = this_00;
  rVar2 = std::chrono::_V2::system_clock::now();
  ppTVar1 = std::__detail::
            _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->transactions,&local_34);
  ((*ppTVar1)->start_time).__d.__r = rVar2;
  this->counter = this->counter + 1;
  pthread_rwlock_unlock((pthread_rwlock_t *)&this->scheduler_lock);
  return local_34;
}

Assistant:

int BOCC_CTA::begin_trans() {
    scheduler_lock.lock();

    //if(transactions.size()>FOCC_OTA_GARB_THRESH) garbageCollect();

    int id = counter;
    transactions[id] = new Transaction(id, M);
    transactions[id]->start_time = std::chrono::high_resolution_clock::now();
    counter++;
    scheduler_lock.unlock();

    return id;
}